

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

ssize_t cf_socket_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,_Bool eos,CURLcode *err
                      )

{
  curl_socket_t cVar1;
  int iVar2;
  void *pvVar3;
  curl_trc_feat *pcVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  char buffer [256];
  char local_138 [264];
  
  pvVar3 = cf->ctx;
  *err = CURLE_OK;
  cVar1 = cf->conn->sock[cf->sockindex];
  iVar2 = *(int *)((long)pvVar3 + 0x98);
  cf->conn->sock[cf->sockindex] = iVar2;
  uVar5 = send(iVar2,buf,len,0x4000);
  if (uVar5 == 0xffffffffffffffff) {
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    if (((iVar2 == 4) || (iVar2 == 0x73)) || (iVar2 == 0xb)) {
      *err = CURLE_AGAIN;
      goto LAB_00115ee3;
    }
    pcVar7 = Curl_strerror(iVar2,local_138,0x100);
    Curl_failf(data,"Send failure: %s",pcVar7);
    (data->state).os_errno = iVar2;
    *err = CURLE_SEND_ERROR;
  }
  else {
LAB_00115ee3:
    if (data == (Curl_easy *)0x0) goto LAB_00115f2b;
  }
  if (((((data->set).field_0x8cd & 0x10) != 0) &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"send(len=%zu) -> %d, err=%d",len,uVar5 & 0xffffffff,(ulong)*err);
  }
LAB_00115f2b:
  cf->conn->sock[cf->sockindex] = cVar1;
  return uVar5;
}

Assistant:

static ssize_t cf_socket_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                              const void *buf, size_t len, bool eos,
                              CURLcode *err)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  curl_socket_t fdsave;
  ssize_t nwritten;
  size_t orig_len = len;

  (void)eos; /* unused */
  *err = CURLE_OK;
  fdsave = cf->conn->sock[cf->sockindex];
  cf->conn->sock[cf->sockindex] = ctx->sock;

#ifdef DEBUGBUILD
  /* simulate network blocking/partial writes */
  if(ctx->wblock_percent > 0) {
    unsigned char c = 0;
    Curl_rand_bytes(data, FALSE, &c, 1);
    if(c >= ((100-ctx->wblock_percent)*256/100)) {
      CURL_TRC_CF(data, cf, "send(len=%zu) SIMULATE EWOULDBLOCK", orig_len);
      *err = CURLE_AGAIN;
      nwritten = -1;
      cf->conn->sock[cf->sockindex] = fdsave;
      return nwritten;
    }
  }
  if(cf->cft != &Curl_cft_udp && ctx->wpartial_percent > 0 && len > 8) {
    len = len * ctx->wpartial_percent / 100;
    if(!len)
      len = 1;
    CURL_TRC_CF(data, cf, "send(len=%zu) SIMULATE partial write of %zu bytes",
                orig_len, len);
  }
#endif

#if defined(MSG_FASTOPEN) && !defined(TCP_FASTOPEN_CONNECT) /* Linux */
  if(cf->conn->bits.tcp_fastopen) {
    nwritten = sendto(ctx->sock, buf, len, MSG_FASTOPEN,
                      &cf->conn->remote_addr->curl_sa_addr,
                      cf->conn->remote_addr->addrlen);
    cf->conn->bits.tcp_fastopen = FALSE;
  }
  else
#endif
    nwritten = swrite(ctx->sock, buf, len);

  if(-1 == nwritten) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr) ||
      (EINPROGRESS == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(data, "Send failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      data->state.os_errno = sockerr;
      *err = CURLE_SEND_ERROR;
    }
  }

#if defined(USE_WINSOCK)
  if(!*err)
    win_update_sndbuf_size(ctx);
#endif

  CURL_TRC_CF(data, cf, "send(len=%zu) -> %d, err=%d",
              orig_len, (int)nwritten, *err);
  cf->conn->sock[cf->sockindex] = fdsave;
  return nwritten;
}